

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

int poptBitsIntersect(poptBits *ap,poptBits b)

{
  poptBits ppVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar3 = 0xffffffec;
  if (b != (poptBits)0x0 && ap != (poptBits *)0x0) {
    uVar5 = _poptBitsM - 1;
    _poptBitsNew(ap);
    ppVar1 = *ap;
    uVar2 = 0;
    uVar3 = 0;
    do {
      uVar4 = ppVar1[uVar2].bits[0] & b[uVar2].bits[0];
      ppVar1[uVar2].bits[0] = uVar4;
      uVar3 = uVar3 | uVar4;
      uVar2 = uVar2 + 1;
    } while ((uVar5 >> 5) + 1 != uVar2);
    uVar3 = (uint)(uVar3 != 0);
  }
  return uVar3;
}

Assistant:

int poptBitsIntersect(poptBits *ap, const poptBits b)
{
    __pbm_bits *abits;
    __pbm_bits *bbits;
    __pbm_bits rc = 0;
    size_t nw = (__PBM_IX(_poptBitsM-1) + 1);
    size_t i;

    if (ap == NULL || b == NULL || _poptBitsNew(ap))
	return POPT_ERROR_NULLARG;
    abits = __PBM_BITS(*ap);
    bbits = __PBM_BITS(b);

    for (i = 0; i < nw; i++) {
        abits[i] &= bbits[i];
	rc |= abits[i];
    }
    return (rc ? 1 : 0);
}